

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * __thiscall
google::protobuf::StrCat_abi_cxx11_
          (string *__return_storage_ptr__,protobuf *this,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  reference pcVar1;
  char *pcVar2;
  long lVar3;
  LogMessage *other;
  LogFinisher local_92;
  byte local_91;
  LogMessage local_90;
  char *local_58;
  char *out;
  reference local_48;
  char *begin;
  undefined1 local_29;
  AlphaNum *local_28;
  AlphaNum *c_local;
  AlphaNum *b_local;
  AlphaNum *a_local;
  string *result;
  
  local_29 = 0;
  local_28 = b;
  c_local = a;
  b_local = (AlphaNum *)this;
  a_local = (AlphaNum *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  strings::AlphaNum::size(b_local);
  strings::AlphaNum::size(c_local);
  strings::AlphaNum::size(local_28);
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  out = (char *)std::__cxx11::string::begin();
  local_48 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&out);
  local_58 = Append2(local_48,b_local,c_local);
  pcVar2 = Append1(local_58,local_28);
  pcVar1 = local_48;
  local_58 = pcVar2;
  lVar3 = std::__cxx11::string::size();
  local_91 = 0;
  if (pcVar2 != pcVar1 + lVar3) {
    internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x5cf);
    local_91 = 1;
    other = internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (out) == (begin + result.size()): ");
    internal::LogFinisher::operator=(&local_92,other);
  }
  if ((local_91 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StrCat(const AlphaNum &a, const AlphaNum &b, const AlphaNum &c) {
  std::string result;
  result.resize(a.size() + b.size() + c.size());
  char *const begin = &*result.begin();
  char *out = Append2(begin, a, b);
  out = Append1(out, c);
  GOOGLE_DCHECK_EQ(out, begin + result.size());
  return result;
}